

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O3

XML_Parser
XML_ExternalEntityParserCreate(XML_Parser oldParser,XML_Char *context,XML_Char *encodingName)

{
  HASH_TABLE *table;
  HASH_TABLE *table_00;
  STRING_POOL *pool;
  XML_Bool XVar1;
  XML_Char XVar2;
  DTD *pDVar3;
  ELEMENT_TYPE *pEVar4;
  XML_Parser pXVar5;
  XML_Parser pXVar6;
  unsigned_long uVar7;
  DTD *table_01;
  size_t sVar8;
  undefined8 *puVar9;
  HASH_TABLE *pHVar10;
  KEY pXVar11;
  XML_StartElementHandler p_Var12;
  XML_EndElementHandler p_Var13;
  XML_CharacterDataHandler p_Var14;
  XML_ProcessingInstructionHandler p_Var15;
  XML_CommentHandler p_Var16;
  XML_StartCdataSectionHandler p_Var17;
  uint uVar18;
  XML_Bool XVar19;
  XML_Parser pXVar20;
  XML_Char *pXVar21;
  NAMED *pNVar22;
  PREFIX *pPVar23;
  NAMED *pNVar24;
  KEY pXVar25;
  NAMED *pNVar26;
  XML_Char *pXVar27;
  DTD *in_RCX;
  NAMED **ppNVar28;
  XML_Parser parser;
  long lVar29;
  int iVar30;
  XML_Parser pXVar31;
  NAMED **ppNVar32;
  long lVar33;
  XML_Char tmp [2];
  KEY local_e8;
  XML_Char *local_d8;
  XML_Char local_ba [2];
  XML_Parser local_b8;
  XML_NotationDeclHandler p_Stack_b0;
  HASH_TABLE *local_a8;
  XML_DefaultHandler p_Stack_a0;
  XML_Char *local_90;
  XML_EntityDeclHandler local_88;
  XML_XmlDeclHandler p_Stack_80;
  XML_ElementDeclHandler local_78;
  XML_AttlistDeclHandler p_Stack_70;
  XML_SkippedEntityHandler local_68;
  XML_UnknownEncodingHandler p_Stack_60;
  XML_NotStandaloneHandler local_58;
  XML_ExternalEntityRefHandler p_Stack_50;
  XML_StartNamespaceDeclHandler local_48;
  XML_EndNamespaceDeclHandler p_Stack_40;
  
  if (oldParser == (XML_Parser)0x0) {
    return (XML_Parser)0x0;
  }
  pDVar3 = oldParser->m_dtd;
  p_Var12 = oldParser->m_startElementHandler;
  p_Var13 = oldParser->m_endElementHandler;
  p_Var14 = oldParser->m_characterDataHandler;
  p_Var15 = oldParser->m_processingInstructionHandler;
  p_Var16 = oldParser->m_commentHandler;
  p_Var17 = oldParser->m_startCdataSectionHandler;
  local_a8 = (HASH_TABLE *)oldParser->m_endCdataSectionHandler;
  p_Stack_a0 = oldParser->m_defaultHandler;
  local_b8 = (XML_Parser)oldParser->m_unparsedEntityDeclHandler;
  p_Stack_b0 = oldParser->m_notationDeclHandler;
  local_48 = oldParser->m_startNamespaceDeclHandler;
  p_Stack_40 = oldParser->m_endNamespaceDeclHandler;
  local_58 = oldParser->m_notStandaloneHandler;
  p_Stack_50 = oldParser->m_externalEntityRefHandler;
  local_68 = oldParser->m_skippedEntityHandler;
  p_Stack_60 = oldParser->m_unknownEncodingHandler;
  local_78 = oldParser->m_elementDeclHandler;
  p_Stack_70 = oldParser->m_attlistDeclHandler;
  local_88 = oldParser->m_entityDeclHandler;
  p_Stack_80 = oldParser->m_xmlDeclHandler;
  pEVar4 = oldParser->m_declElementType;
  pXVar31 = (XML_Parser)oldParser->m_userData;
  pXVar5 = (XML_Parser)oldParser->m_handlerArg;
  XVar19 = oldParser->m_defaultExpandInternalEntities;
  pXVar6 = oldParser->m_externalEntityRefHandlerArg;
  XVar1 = oldParser->m_ns_triplets;
  uVar7 = oldParser->m_hash_secret_salt;
  if (oldParser->m_ns == '\0') {
    pXVar21 = (XML_Char *)0x0;
  }
  else {
    local_ba[0] = oldParser->m_namespaceSeparator;
    in_RCX = (DTD *)CONCAT71((int7)((ulong)in_RCX >> 8),local_ba[0]);
    pXVar21 = local_ba;
  }
  local_90 = context;
  pXVar20 = parserCreate(encodingName,&oldParser->m_mem,pXVar21,in_RCX);
  if (pXVar20 != (XML_Parser)0x0) {
    pXVar20->m_startElementHandler = p_Var12;
    pXVar20->m_endElementHandler = p_Var13;
    pXVar20->m_characterDataHandler = p_Var14;
    pXVar20->m_processingInstructionHandler = p_Var15;
    pXVar20->m_commentHandler = p_Var16;
    pXVar20->m_startCdataSectionHandler = p_Var17;
    pXVar20->m_endCdataSectionHandler = (XML_EndCdataSectionHandler)local_a8;
    pXVar20->m_defaultHandler = p_Stack_a0;
    pXVar20->m_unparsedEntityDeclHandler = (XML_UnparsedEntityDeclHandler)local_b8;
    pXVar20->m_notationDeclHandler = p_Stack_b0;
    pXVar20->m_startNamespaceDeclHandler = local_48;
    pXVar20->m_endNamespaceDeclHandler = p_Stack_40;
    pXVar20->m_notStandaloneHandler = local_58;
    pXVar20->m_externalEntityRefHandler = p_Stack_50;
    pXVar20->m_skippedEntityHandler = local_68;
    pXVar20->m_unknownEncodingHandler = p_Stack_60;
    pXVar20->m_elementDeclHandler = local_78;
    pXVar20->m_attlistDeclHandler = p_Stack_70;
    pXVar20->m_entityDeclHandler = local_88;
    pXVar20->m_xmlDeclHandler = p_Stack_80;
    pXVar20->m_declElementType = pEVar4;
    pXVar20->m_userData = pXVar31;
    if (pXVar31 != pXVar5) {
      pXVar31 = pXVar20;
    }
    pXVar20->m_handlerArg = pXVar31;
    if (pXVar6 != oldParser) {
      pXVar20->m_externalEntityRefHandlerArg = pXVar6;
    }
    pXVar20->m_defaultExpandInternalEntities = XVar19;
    pXVar20->m_ns_triplets = XVar1;
    pXVar20->m_hash_secret_salt = uVar7;
    pXVar20->m_parentParser = oldParser;
    table_01 = pXVar20->m_dtd;
    ppNVar32 = (pDVar3->prefixes).v;
    sVar8 = (pDVar3->prefixes).size;
    pool = &table_01->pool;
    table = &table_01->prefixes;
    local_b8 = pXVar20;
    for (lVar29 = 0; sVar8 << 3 != lVar29; lVar29 = lVar29 + 8) {
      puVar9 = *(undefined8 **)((long)ppNVar32 + lVar29);
      if ((puVar9 != (undefined8 *)0x0) &&
         ((pXVar21 = poolCopyString(pool,(XML_Char *)*puVar9), pXVar21 == (XML_Char *)0x0 ||
          (pNVar22 = lookup(oldParser,table,pXVar21,0x10), pNVar22 == (NAMED *)0x0))))
      goto LAB_0047d66c;
    }
    ppNVar32 = (pDVar3->attributeIds).v;
    sVar8 = (pDVar3->attributeIds).size;
    table_00 = &table_01->attributeIds;
    local_a8 = (HASH_TABLE *)&pDVar3->defaultPrefix;
    for (lVar29 = 0; sVar8 << 3 != lVar29; lVar29 = lVar29 + 8) {
      puVar9 = *(undefined8 **)((long)ppNVar32 + lVar29);
      if (puVar9 != (undefined8 *)0x0) {
        pXVar21 = (table_01->pool).ptr;
        if (pXVar21 == (table_01->pool).end) {
          XVar19 = poolGrow(pool);
          if (XVar19 == '\0') goto LAB_0047d66c;
          pXVar21 = (table_01->pool).ptr;
        }
        (table_01->pool).ptr = pXVar21 + 1;
        *pXVar21 = '\0';
        pXVar21 = poolCopyString(pool,(XML_Char *)*puVar9);
        if ((pXVar21 == (XML_Char *)0x0) ||
           (pNVar22 = lookup(oldParser,table_00,pXVar21 + 1,0x18), pNVar22 == (NAMED *)0x0))
        goto LAB_0047d66c;
        *(undefined1 *)&pNVar22[2].name = *(undefined1 *)(puVar9 + 2);
        pHVar10 = (HASH_TABLE *)puVar9[1];
        if (pHVar10 != (HASH_TABLE *)0x0) {
          *(undefined1 *)((long)&pNVar22[2].name + 1) = *(undefined1 *)((long)puVar9 + 0x11);
          pPVar23 = &table_01->defaultPrefix;
          if (pHVar10 != local_a8) {
            pPVar23 = (PREFIX *)lookup(oldParser,table,(KEY)pHVar10->v,0);
          }
          pNVar22[1].name = (KEY)pPVar23;
        }
      }
    }
    ppNVar32 = (pDVar3->elementTypes).v;
    ppNVar28 = ppNVar32 + (pDVar3->elementTypes).size;
    local_a8 = &table_01->elementTypes;
    while (ppNVar32 != ppNVar28) {
      pNVar22 = *ppNVar32;
      ppNVar32 = ppNVar32 + 1;
      if (pNVar22 != (NAMED *)0x0) {
        pXVar21 = poolCopyString(pool,pNVar22->name);
        if ((pXVar21 == (XML_Char *)0x0) ||
           (pNVar24 = lookup(oldParser,local_a8,pXVar21,0x28), pNVar24 == (NAMED *)0x0))
        goto LAB_0047d66c;
        if ((long)*(int *)&pNVar22[3].name != 0) {
          pXVar25 = (KEY)(*(local_b8->m_mem).malloc_fcn)((long)*(int *)&pNVar22[3].name * 0x18);
          pNVar24[4].name = pXVar25;
          if (pXVar25 == (KEY)0x0) goto LAB_0047d66c;
        }
        if (pNVar22[2].name != (KEY)0x0) {
          pNVar26 = lookup(oldParser,table_00,*(KEY *)pNVar22[2].name,0);
          pNVar24[2].name = (KEY)pNVar26;
        }
        iVar30 = *(int *)&pNVar22[3].name;
        *(int *)&pNVar24[3].name = iVar30;
        *(int *)((long)&pNVar24[3].name + 4) = iVar30;
        if (pNVar22[1].name != (KEY)0x0) {
          pNVar26 = lookup(oldParser,table,*(KEY *)pNVar22[1].name,0);
          pNVar24[1].name = (KEY)pNVar26;
          iVar30 = *(int *)&pNVar24[3].name;
        }
        if (0 < iVar30) {
          lVar29 = 0;
          lVar33 = 0;
          do {
            pNVar26 = lookup(oldParser,table_00,(KEY)**(undefined8 **)(pNVar22[4].name + lVar29),0);
            pXVar25 = pNVar24[4].name;
            *(NAMED **)(pXVar25 + lVar29) = pNVar26;
            pXVar11 = pNVar22[4].name;
            pXVar25[lVar29 + 8] = pXVar11[lVar29 + 8];
            pXVar21 = *(XML_Char **)(pXVar11 + lVar29 + 0x10);
            if (pXVar21 == (XML_Char *)0x0) {
              pXVar25 = pXVar25 + lVar29 + 0x10;
              pXVar25[0] = '\0';
              pXVar25[1] = '\0';
              pXVar25[2] = '\0';
              pXVar25[3] = '\0';
              pXVar25[4] = '\0';
              pXVar25[5] = '\0';
              pXVar25[6] = '\0';
              pXVar25[7] = '\0';
            }
            else {
              pXVar21 = poolCopyString(pool,pXVar21);
              *(XML_Char **)(pNVar24[4].name + lVar29 + 0x10) = pXVar21;
              if (pXVar21 == (XML_Char *)0x0) goto LAB_0047d66c;
            }
            lVar33 = lVar33 + 1;
            lVar29 = lVar29 + 0x18;
          } while (lVar33 < *(int *)&pNVar24[3].name);
        }
      }
    }
    ppNVar28 = (pDVar3->generalEntities).v;
    ppNVar32 = ppNVar28 + (pDVar3->generalEntities).size;
    local_e8 = (KEY)0x0;
    local_d8 = (XML_Char *)0x0;
    while (ppNVar28 != ppNVar32) {
      pNVar22 = *ppNVar28;
      ppNVar28 = ppNVar28 + 1;
      if (pNVar22 != (NAMED *)0x0) {
        pXVar21 = poolCopyString(pool,pNVar22->name);
        if ((pXVar21 == (XML_Char *)0x0) ||
           (pNVar24 = lookup(oldParser,&table_01->generalEntities,pXVar21,0x40),
           pNVar24 == (NAMED *)0x0)) goto LAB_0047d66c;
        if (pNVar22[3].name == (XML_Char *)0x0) {
          pXVar21 = pNVar22[1].name;
          iVar30 = *(int *)&pNVar22[2].name;
          if (((table_01->pool).ptr == (XML_Char *)0x0) && (XVar19 = poolGrow(pool), XVar19 == '\0')
             ) goto LAB_0047d66c;
          if (0 < iVar30) {
            iVar30 = iVar30 + 1;
            do {
              pXVar27 = (table_01->pool).ptr;
              if (pXVar27 == (table_01->pool).end) {
                XVar19 = poolGrow(pool);
                if (XVar19 == '\0') goto LAB_0047d66c;
                pXVar27 = (table_01->pool).ptr;
              }
              XVar2 = *pXVar21;
              (table_01->pool).ptr = pXVar27 + 1;
              *pXVar27 = XVar2;
              pXVar21 = pXVar21 + 1;
              iVar30 = iVar30 + -1;
            } while (1 < iVar30);
          }
          pXVar21 = (table_01->pool).start;
          (table_01->pool).start = (table_01->pool).ptr;
          if (pXVar21 == (XML_Char *)0x0) goto LAB_0047d66c;
          pNVar24[1].name = pXVar21;
          *(undefined4 *)&pNVar24[2].name = *(undefined4 *)&pNVar22[2].name;
        }
        else {
          pXVar21 = poolCopyString(pool,pNVar22[3].name);
          if (pXVar21 == (XML_Char *)0x0) goto LAB_0047d66c;
          pNVar24[3].name = pXVar21;
          pXVar21 = pNVar22[4].name;
          if (pXVar21 != (XML_Char *)0x0) {
            if ((pXVar21 != local_d8) &&
               (local_e8 = poolCopyString(pool,pXVar21), local_d8 = pXVar21,
               local_e8 == (XML_Char *)0x0)) goto LAB_0047d66c;
            pNVar24[4].name = local_e8;
          }
          if (pNVar22[5].name != (XML_Char *)0x0) {
            pXVar21 = poolCopyString(pool,pNVar22[5].name);
            if (pXVar21 == (XML_Char *)0x0) goto LAB_0047d66c;
            pNVar24[5].name = pXVar21;
          }
        }
        if (pNVar22[6].name != (XML_Char *)0x0) {
          pXVar21 = poolCopyString(pool,pNVar22[6].name);
          if (pXVar21 == (XML_Char *)0x0) goto LAB_0047d66c;
          pNVar24[6].name = pXVar21;
        }
        *(undefined1 *)((long)&pNVar24[7].name + 1) = *(undefined1 *)((long)&pNVar22[7].name + 1);
        *(undefined1 *)((long)&pNVar24[7].name + 2) = *(undefined1 *)((long)&pNVar22[7].name + 2);
      }
    }
    table_01->keepProcessing = pDVar3->keepProcessing;
    table_01->hasParamEntityRefs = pDVar3->hasParamEntityRefs;
    table_01->standalone = pDVar3->standalone;
    table_01->in_eldecl = pDVar3->in_eldecl;
    table_01->scaffold = pDVar3->scaffold;
    uVar18 = pDVar3->scaffSize;
    table_01->contentStringLen = pDVar3->contentStringLen;
    table_01->scaffSize = uVar18;
    table_01->scaffLevel = pDVar3->scaffLevel;
    table_01->scaffIndex = pDVar3->scaffIndex;
    XVar19 = setContext(local_b8,local_90);
    if (XVar19 != '\0') {
      local_b8->m_processor = externalEntityInitProcessor;
      return local_b8;
    }
LAB_0047d66c:
    XML_ParserFree(local_b8);
  }
  return (XML_Parser)0x0;
}

Assistant:

XML_Parser XMLCALL
XML_ExternalEntityParserCreate(XML_Parser oldParser,
                               const XML_Char *context,
                               const XML_Char *encodingName)
{
  XML_Parser parser = oldParser;
  DTD *newDtd = NULL;
  DTD *oldDtd;
  XML_StartElementHandler oldStartElementHandler;
  XML_EndElementHandler oldEndElementHandler;
  XML_CharacterDataHandler oldCharacterDataHandler;
  XML_ProcessingInstructionHandler oldProcessingInstructionHandler;
  XML_CommentHandler oldCommentHandler;
  XML_StartCdataSectionHandler oldStartCdataSectionHandler;
  XML_EndCdataSectionHandler oldEndCdataSectionHandler;
  XML_DefaultHandler oldDefaultHandler;
  XML_UnparsedEntityDeclHandler oldUnparsedEntityDeclHandler;
  XML_NotationDeclHandler oldNotationDeclHandler;
  XML_StartNamespaceDeclHandler oldStartNamespaceDeclHandler;
  XML_EndNamespaceDeclHandler oldEndNamespaceDeclHandler;
  XML_NotStandaloneHandler oldNotStandaloneHandler;
  XML_ExternalEntityRefHandler oldExternalEntityRefHandler;
  XML_SkippedEntityHandler oldSkippedEntityHandler;
  XML_UnknownEncodingHandler oldUnknownEncodingHandler;
  XML_ElementDeclHandler oldElementDeclHandler;
  XML_AttlistDeclHandler oldAttlistDeclHandler;
  XML_EntityDeclHandler oldEntityDeclHandler;
  XML_XmlDeclHandler oldXmlDeclHandler;
  ELEMENT_TYPE * oldDeclElementType;

  void *oldUserData;
  void *oldHandlerArg;
  XML_Bool oldDefaultExpandInternalEntities;
  XML_Parser oldExternalEntityRefHandlerArg;
#ifdef XML_DTD
  enum XML_ParamEntityParsing oldParamEntityParsing;
  int oldInEntityValue;
#endif
  XML_Bool oldns_triplets;
  /* Note that the new parser shares the same hash secret as the old
     parser, so that dtdCopy and copyEntityTable can lookup values
     from hash tables associated with either parser without us having
     to worry which hash secrets each table has.
  */
  unsigned long oldhash_secret_salt;

  /* Validate the oldParser parameter before we pull everything out of it */
  if (oldParser == NULL)
    return NULL;

  /* Stash the original parser contents on the stack */
  oldDtd = _dtd;
  oldStartElementHandler = startElementHandler;
  oldEndElementHandler = endElementHandler;
  oldCharacterDataHandler = characterDataHandler;
  oldProcessingInstructionHandler = processingInstructionHandler;
  oldCommentHandler = commentHandler;
  oldStartCdataSectionHandler = startCdataSectionHandler;
  oldEndCdataSectionHandler = endCdataSectionHandler;
  oldDefaultHandler = defaultHandler;
  oldUnparsedEntityDeclHandler = unparsedEntityDeclHandler;
  oldNotationDeclHandler = notationDeclHandler;
  oldStartNamespaceDeclHandler = startNamespaceDeclHandler;
  oldEndNamespaceDeclHandler = endNamespaceDeclHandler;
  oldNotStandaloneHandler = notStandaloneHandler;
  oldExternalEntityRefHandler = externalEntityRefHandler;
  oldSkippedEntityHandler = skippedEntityHandler;
  oldUnknownEncodingHandler = unknownEncodingHandler;
  oldElementDeclHandler = elementDeclHandler;
  oldAttlistDeclHandler = attlistDeclHandler;
  oldEntityDeclHandler = entityDeclHandler;
  oldXmlDeclHandler = xmlDeclHandler;
  oldDeclElementType = declElementType;

  oldUserData = userData;
  oldHandlerArg = handlerArg;
  oldDefaultExpandInternalEntities = defaultExpandInternalEntities;
  oldExternalEntityRefHandlerArg = externalEntityRefHandlerArg;
#ifdef XML_DTD
  oldParamEntityParsing = paramEntityParsing;
  oldInEntityValue = prologState.inEntityValue;
#endif
  oldns_triplets = ns_triplets;
  /* Note that the new parser shares the same hash secret as the old
     parser, so that dtdCopy and copyEntityTable can lookup values
     from hash tables associated with either parser without us having
     to worry which hash secrets each table has.
  */
  oldhash_secret_salt = hash_secret_salt;

#ifdef XML_DTD
  if (!context)
    newDtd = oldDtd;
#endif /* XML_DTD */

  /* Note that the magical uses of the pre-processor to make field
     access look more like C++ require that `parser' be overwritten
     here.  This makes this function more painful to follow than it
     would be otherwise.
  */
  if (ns) {
    XML_Char tmp[2];
    *tmp = namespaceSeparator;
    parser = parserCreate(encodingName, &parser->m_mem, tmp, newDtd);
  }
  else {
    parser = parserCreate(encodingName, &parser->m_mem, NULL, newDtd);
  }

  if (!parser)
    return NULL;

  startElementHandler = oldStartElementHandler;
  endElementHandler = oldEndElementHandler;
  characterDataHandler = oldCharacterDataHandler;
  processingInstructionHandler = oldProcessingInstructionHandler;
  commentHandler = oldCommentHandler;
  startCdataSectionHandler = oldStartCdataSectionHandler;
  endCdataSectionHandler = oldEndCdataSectionHandler;
  defaultHandler = oldDefaultHandler;
  unparsedEntityDeclHandler = oldUnparsedEntityDeclHandler;
  notationDeclHandler = oldNotationDeclHandler;
  startNamespaceDeclHandler = oldStartNamespaceDeclHandler;
  endNamespaceDeclHandler = oldEndNamespaceDeclHandler;
  notStandaloneHandler = oldNotStandaloneHandler;
  externalEntityRefHandler = oldExternalEntityRefHandler;
  skippedEntityHandler = oldSkippedEntityHandler;
  unknownEncodingHandler = oldUnknownEncodingHandler;
  elementDeclHandler = oldElementDeclHandler;
  attlistDeclHandler = oldAttlistDeclHandler;
  entityDeclHandler = oldEntityDeclHandler;
  xmlDeclHandler = oldXmlDeclHandler;
  declElementType = oldDeclElementType;
  userData = oldUserData;
  if (oldUserData == oldHandlerArg)
    handlerArg = userData;
  else
    handlerArg = parser;
  if (oldExternalEntityRefHandlerArg != oldParser)
    externalEntityRefHandlerArg = oldExternalEntityRefHandlerArg;
  defaultExpandInternalEntities = oldDefaultExpandInternalEntities;
  ns_triplets = oldns_triplets;
  hash_secret_salt = oldhash_secret_salt;
  parentParser = oldParser;
#ifdef XML_DTD
  paramEntityParsing = oldParamEntityParsing;
  prologState.inEntityValue = oldInEntityValue;
  if (context) {
#endif /* XML_DTD */
    if (!dtdCopy(oldParser, _dtd, oldDtd, &parser->m_mem)
      || !setContext(parser, context)) {
      XML_ParserFree(parser);
      return NULL;
    }
    processor = externalEntityInitProcessor;
#ifdef XML_DTD
  }
  else {
    /* The DTD instance referenced by _dtd is shared between the document's
       root parser and external PE parsers, therefore one does not need to
       call setContext. In addition, one also *must* not call setContext,
       because this would overwrite existing prefix->binding pointers in
       _dtd with ones that get destroyed with the external PE parser.
       This would leave those prefixes with dangling pointers.
    */
    isParamEntity = XML_TRUE;
    XmlPrologStateInitExternalEntity(&prologState);
    processor = externalParEntInitProcessor;
  }
#endif /* XML_DTD */
  return parser;
}